

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O0

Gia_Man_t * Bmc_CexTargetEnlarge(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_40;
  int local_3c;
  int k;
  int i;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pOne;
  Gia_Man_t *pNew;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManHashAlloc(p_00);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar6 = false;
      if (local_3c < iVar1) {
        pObjRo = Gia_ManCi(p,local_3c);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      Gia_ManAppendCi(p_00);
      local_3c = local_3c + 1;
    }
  }
  local_3c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_3c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pObjRo = Gia_ManCi(p,iVar1 + local_3c);
      bVar6 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pObjRo->Value = uVar2;
    local_3c = local_3c + 1;
  }
  for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar6 = false;
      if (local_3c < iVar1) {
        pObjRo = Gia_ManCi(p,local_3c);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ManPiNum(p);
      uVar2 = Gia_ManCiLit(p_00,((nFrames + -1) - local_40) * iVar1 + local_3c);
      pObjRo->Value = uVar2;
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      bVar6 = false;
      if (local_3c < p->nObjs) {
        pObjRo = Gia_ManObj(p,local_3c);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjIsAnd(pObjRo);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pObjRo);
        iLit1 = Gia_ObjFanin1Copy(pObjRo);
        uVar2 = Gia_ManHashAnd(p_00,iVar1,iLit1);
        pObjRo->Value = uVar2;
      }
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar6 = false;
      if (local_3c < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar1 + local_3c);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      uVar2 = Gia_ObjFanin0Copy(pObjRo);
      pObjRo->Value = uVar2;
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar6 = false;
      if (local_3c < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar1 + local_3c);
        bVar6 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar1 = Gia_ManPiNum(p);
          _k = Gia_ManCi(p,iVar1 + local_3c);
          bVar6 = _k != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar6) break;
      _k->Value = pObjRo->Value;
      local_3c = local_3c + 1;
    }
  }
  pGVar4 = Gia_ManPo(p,0);
  iVar1 = Gia_ObjFanin0Copy(pGVar4);
  uVar2 = Gia_ManAppendCo(p_00,iVar1);
  pGVar4->Value = uVar2;
  Gia_ManHashStop(p_00);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Bmc_CexTargetEnlarge( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( k = 0; k < nFrames; k++ )
        Gia_ManForEachPi( p, pObj, i )
            Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( k = 0; k < nFrames; k++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, (nFrames - 1 - k) * Gia_ManPiNum(p) + i );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value  = pObj->Value;
    }
    pObj = Gia_ManPo( p, 0 );
    pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}